

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_quaternion rf_quaternion_normalize(rf_quaternion q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  rf_quaternion rVar6;
  
  fVar4 = q.z;
  fVar5 = q.w;
  fVar1 = q.x;
  fVar3 = q.y;
  fVar2 = fVar5 * fVar5 + fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = (float)(-(uint)(fVar2 == 0.0) & 0x3f800000 | ~-(uint)(fVar2 == 0.0) & (uint)(1.0 / fVar2))
  ;
  rVar6.y = fVar3 * fVar2;
  rVar6.x = fVar1 * fVar2;
  rVar6.w = fVar2 * fVar5;
  rVar6.z = fVar4 * fVar2;
  return rVar6;
}

Assistant:

RF_API rf_quaternion rf_quaternion_normalize(rf_quaternion q)
{
    rf_quaternion result = {0};

    float length, ilength;
    length = rf_quaternion_len(q);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f / length;

    result.x = q.x * ilength;
    result.y = q.y * ilength;
    result.z = q.z * ilength;
    result.w = q.w * ilength;

    return result;
}